

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_set_lexicon.cc
# Opt level: O3

IdSet * __thiscall
IdSetLexicon::id_set(IdSet *__return_storage_ptr__,IdSetLexicon *this,int32 set_id)

{
  pointer puVar1;
  pointer piVar2;
  ulong uVar3;
  ulong uVar4;
  S2LogMessage SStack_18;
  
  if (set_id < 0) {
    puVar1 = (this->id_sets_).begins_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = (ulong)puVar1[(uint)~set_id];
    uVar4 = (ulong)puVar1[(uint)-set_id];
    if (uVar4 * 4 == uVar3 * 4) {
      S2LogMessage::S2LogMessage
                (&SStack_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/id_set_lexicon.cc"
                 ,0x4e,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_18.stream_,"Check failed: (0) != (sequence.size()) ",0x27);
      abort();
    }
    piVar2 = (this->id_sets_).values_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    __return_storage_ptr__->begin_ = piVar2 + uVar3;
    __return_storage_ptr__->end_ = piVar2 + uVar4;
  }
  else {
    __return_storage_ptr__->begin_ = &__return_storage_ptr__->singleton_id_;
    __return_storage_ptr__->end_ = (Iterator)&__return_storage_ptr__->field_0x14;
    __return_storage_ptr__->singleton_id_ = set_id;
  }
  return __return_storage_ptr__;
}

Assistant:

IdSetLexicon::IdSet IdSetLexicon::id_set(int32 set_id) const {
  if (set_id >= 0) {
    return IdSet(set_id);
  } else if (set_id == kEmptySetId) {
    return IdSet();
  } else {
    auto sequence = id_sets_.sequence(~set_id);
    S2_DCHECK_NE(0, sequence.size());
    return IdSet(&*sequence.begin(), &*sequence.begin() + sequence.size());
  }
}